

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanEndTag(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  XML_Convert_Result XVar2;
  uint uVar3;
  char **ppcVar4;
  unsigned_short **ppuVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar6;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  unsigned_short *in_R8;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 1) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    ppcVar4 = (char **)ptr;
    iVar1 = (*enc[3].literalScanners[0])(enc,ptr,end,(char **)ptr);
    if ((iVar1 != 0) || (iVar1 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX,ppcVar4), iVar1 == 0)) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 2;
    pcVar6 = extraout_RDX_00;
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    ppcVar4 = (char **)ptr;
    iVar1 = (*enc[3].literalScanners[1])(enc,ptr,end,(char **)ptr);
    if ((iVar1 != 0) || (iVar1 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_01,ppcVar4), iVar1 == 0)
       ) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 3;
    pcVar6 = extraout_RDX_02;
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    ppcVar4 = (char **)ptr;
    iVar1 = (*enc[3].nameMatchesAscii)(enc,ptr,end,ptr);
    if ((iVar1 != 0) || (iVar1 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX_03,ppcVar4), iVar1 == 0)
       ) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 4;
    pcVar6 = extraout_RDX_04;
    break;
  default:
    *nextTokPtr = ptr;
    return 0;
  case 0x16:
  case 0x18:
    end_local = ptr + 1;
    pcVar6 = end;
    break;
  case 0x1d:
    *nextTokPtr = ptr;
    return 0;
  }
  do {
    if ((long)end - (long)end_local < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      ppuVar5 = (unsigned_short **)end_local;
      iVar1 = (*enc[3].literalScanners[0])(enc,end_local,pcVar6,(char **)end_local);
      if ((iVar1 != 0) ||
         (XVar2 = (*enc[2].utf16Convert)(enc,(char **)end_local,extraout_RDX_05,ppuVar5,in_R8),
         XVar2 == XML_CONVERT_COMPLETED)) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 2;
      pcVar6 = extraout_RDX_06;
      break;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      iVar1 = (*enc[3].literalScanners[1])(enc,end_local,pcVar6,(char **)end_local);
      if ((iVar1 != 0) || (iVar1 = (**(code **)&enc[2].minBytesPerChar)(enc,end_local), iVar1 == 0))
      {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 3;
      pcVar6 = extraout_RDX_07;
      break;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      ppcVar4 = (char **)end_local;
      iVar1 = (*enc[3].nameMatchesAscii)(enc,end_local,pcVar6,end_local);
      if ((iVar1 != 0) ||
         (iVar1 = (*enc[3].scanners[0])(enc,end_local,extraout_RDX_08,ppcVar4), iVar1 == 0)) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 4;
      pcVar6 = extraout_RDX_09;
      break;
    default:
      *nextTokPtr = end_local;
      return 0;
    case 9:
    case 10:
    case 0x15:
      while( true ) {
        do {
          pcVar6 = end_local;
          end_local = pcVar6 + 1;
          if ((long)end - (long)end_local < 1) {
            return -1;
          }
          uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
        } while (uVar3 - 9 < 2);
        if (uVar3 == 0xb) break;
        if (uVar3 != 0x15) {
          *nextTokPtr = end_local;
          return 0;
        }
      }
      *nextTokPtr = pcVar6 + 2;
      return 5;
    case 0xb:
      *nextTokPtr = end_local + 1;
      return 5;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      end_local = end_local + 1;
      break;
    case 0x17:
      end_local = end_local + 1;
      break;
    case 0x1d:
      *nextTokPtr = end_local;
      return 0;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanEndTag)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S:
    case BT_CR:
    case BT_LF:
      for (ptr += MINBPC(enc); HAS_CHAR(enc, ptr, end); ptr += MINBPC(enc)) {
        switch (BYTE_TYPE(enc, ptr)) {
        case BT_S:
        case BT_CR:
        case BT_LF:
          break;
        case BT_GT:
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_END_TAG;
        default:
          *nextTokPtr = ptr;
          return XML_TOK_INVALID;
        }
      }
      return XML_TOK_PARTIAL;
#  ifdef XML_NS
    case BT_COLON:
      /* no need to check qname syntax here,
         since end-tag must match exactly */
      ptr += MINBPC(enc);
      break;
#  endif
    case BT_GT:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_END_TAG;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}